

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void el::base::utils::File::buildBaseFilename
               (string *fullPath,char *buff,size_t limit,char *separator)

{
  long lVar1;
  size_t sVar2;
  long local_48;
  size_t sizeOfFilename;
  size_t lastSlashAt;
  char *filename;
  char *separator_local;
  size_t limit_local;
  char *buff_local;
  string *fullPath_local;
  
  lVar1 = ::std::__cxx11::string::c_str();
  local_48 = ::std::__cxx11::string::find_last_of((char *)fullPath,(ulong)separator);
  if (local_48 == 0) {
    local_48 = 0;
  }
  else {
    local_48 = local_48 + 1;
  }
  lastSlashAt = local_48 + lVar1;
  sVar2 = strlen((char *)lastSlashAt);
  if (((limit <= sVar2) &&
      (lastSlashAt = lastSlashAt + (sVar2 - limit), *(char *)lastSlashAt != '.')) &&
     (*(char *)(lastSlashAt + 1) != '.')) {
    lastSlashAt = lastSlashAt + 3;
    strcat(buff,"..");
  }
  strcat(buff,(char *)lastSlashAt);
  return;
}

Assistant:

void File::buildBaseFilename(const std::string& fullPath, char buff[], std::size_t limit, const char* separator) {
  const char *filename = fullPath.c_str();
  std::size_t lastSlashAt = fullPath.find_last_of(separator);
  filename += lastSlashAt ? lastSlashAt+1 : 0;
  std::size_t sizeOfFilename = strlen(filename);
  if (sizeOfFilename >= limit) {
    filename += (sizeOfFilename - limit);
    if (filename[0] != '.' && filename[1] != '.') {  // prepend if not already
      filename += 3;  // 3 = '..'
      STRCAT(buff, "..", limit);
    }
  }
  STRCAT(buff, filename, limit);
}